

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergeFrom
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  NearestNeighborsIndex *this_00;
  Int64Parameter *this_01;
  StringVector *this_02;
  StringVector *from_00;
  Int64Vector *this_03;
  Int64Vector *from_01;
  UniformWeighting *this_04;
  UniformWeighting *from_02;
  InverseDistanceWeighting *this_05;
  InverseDistanceWeighting *from_03;
  NearestNeighborsIndex *from_04;
  Int64Parameter *from_05;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x260);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) &&
     (from->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0)) {
    this_00 = mutable_nearestneighborsindex(this);
    from_04 = from->nearestneighborsindex_;
    if (from_04 == (NearestNeighborsIndex *)0x0) {
      from_04 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
    }
    NearestNeighborsIndex::MergeFrom(this_00,from_04);
  }
  if ((from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) &&
     (from->numberofneighbors_ != (Int64Parameter *)0x0)) {
    this_01 = mutable_numberofneighbors(this);
    from_05 = from->numberofneighbors_;
    if (from_05 == (Int64Parameter *)0x0) {
      from_05 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this_01,from_05);
  }
  if (from->_oneof_case_[0] == 0x65) {
    this_03 = mutable_int64classlabels(this);
    from_01 = int64classlabels(from);
    Int64Vector::MergeFrom(this_03,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    this_02 = mutable_stringclasslabels(this);
    from_00 = stringclasslabels(from);
    StringVector::MergeFrom(this_02,from_00);
  }
  if (from->_oneof_case_[1] == 0x6f) {
    set_defaultint64label(this,(from->DefaultClassLabel_).defaultint64label_);
  }
  else if (from->_oneof_case_[1] == 0x6e) {
    set_defaultstringlabel(this,(string *)from->DefaultClassLabel_);
  }
  if (from->_oneof_case_[2] == 0xd2) {
    this_05 = mutable_inversedistanceweighting(this);
    from_03 = inversedistanceweighting(from);
    InverseDistanceWeighting::MergeFrom(this_05,from_03);
  }
  else if (from->_oneof_case_[2] == 200) {
    this_04 = mutable_uniformweighting(this);
    from_02 = uniformweighting(from);
    UniformWeighting::MergeFrom(this_04,from_02);
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::MergeFrom(const KNearestNeighborsClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.KNearestNeighborsClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_nearestneighborsindex()) {
    mutable_nearestneighborsindex()->::CoreML::Specification::NearestNeighborsIndex::MergeFrom(from.nearestneighborsindex());
  }
  if (from.has_numberofneighbors()) {
    mutable_numberofneighbors()->::CoreML::Specification::Int64Parameter::MergeFrom(from.numberofneighbors());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
}